

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O0

bool __thiscall
SuperCardPro::WriteFlux
          (SuperCardPro *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *flux_times)

{
  pointer this_00;
  bool bVar1;
  size_type sVar2;
  reference puVar3;
  unsigned_short *bulkbuf;
  undefined1 local_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 local_90;
  uint8_t params [5];
  uint32_t start_len [2];
  unsigned_long flux_bytes;
  size_type flux_count;
  uint local_68;
  uint local_64;
  uint time_ticks;
  uint time_ns;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  undefined1 local_38 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> flux_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *flux_times_local;
  SuperCardPro *this_local;
  
  flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)flux_times;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,sVar2);
  this_00 = flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      flux_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  _time_ticks = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)&time_ticks), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    local_64 = *puVar3;
    for (local_68 = (((local_64 + 0xc) / 0x19) * opt.scale) / 100 | 1; 0xffff < local_68;
        local_68 = local_68 - 0x10000) {
      flux_count._6_2_ = 0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,
                 (value_type_conflict4 *)((long)&flux_count + 6));
    }
    flux_count._4_2_ = util::htobe<unsigned_short>((unsigned_short)local_68);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,
               (value_type_conflict4 *)((long)&flux_count + 4));
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  if (bVar1) {
    flux_count._2_2_ = 0xa0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,
               (value_type_conflict4 *)((long)&flux_count + 2));
  }
  sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  start_len[0] = (int)sVar2 * 2;
  stack0xffffffffffffff78 = 0;
  util::htobe<unsigned_int>(start_len[0]);
  bulkbuf = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  bVar1 = SendCmd(this,0xaa,params + 4,8,bulkbuf,start_len[0]);
  if (bVar1) {
    flux_bytes._3_1_ = (undefined1)(sVar2 >> 0x18);
    flux_bytes._2_1_ = (undefined1)(sVar2 >> 0x10);
    flux_bytes._1_1_ = (undefined1)(sVar2 >> 8);
    flux_bytes._0_1_ = (undefined1)sVar2;
    _local_94 = CONCAT13((undefined1)flux_bytes,
                         CONCAT12(flux_bytes._1_1_,CONCAT11(flux_bytes._2_1_,flux_bytes._3_1_)));
    local_90 = 5;
    bVar1 = SendCmd(this,0xa2,&local_94,5,(void *)0x0,0);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  params[0] = '\x01';
  params[1] = '\0';
  params[2] = '\0';
  params[3] = '\0';
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  return this_local._7_1_;
}

Assistant:

bool SuperCardPro::WriteFlux(const std::vector<uint32_t>& flux_times)
{
    std::vector<uint16_t> flux_data;
    flux_data.reserve(flux_times.size());
    for (auto time_ns : flux_times)
    {
        auto time_ticks{ (time_ns + (NS_PER_TICK / 2)) / NS_PER_TICK };
        time_ticks = time_ticks * opt.scale / 100;
        time_ticks |= 1;

        while (time_ticks >= 0x10000)
        {
            flux_data.push_back(0);
            time_ticks -= 0x10000;
        }

        flux_data.push_back(util::htobe(static_cast<uint16_t>(time_ticks)));
    }

    if (flux_data.empty())
        flux_data.push_back(4'000 / NS_PER_TICK);

    auto flux_count{ flux_data.size() };
    auto flux_bytes{ flux_count * sizeof(flux_data[0]) };

    uint32_t start_len[2];
    start_len[0] = 0;
    start_len[1] = util::htobe(static_cast<uint32_t>(flux_bytes));
    if (!SendCmd(CMD_LOADRAM_USB, &start_len, static_cast<int>(sizeof(start_len)), flux_data.data(), static_cast<int>(flux_bytes)))
        return false;

    uint8_t params[5] = {};
    params[0] = static_cast<uint8_t>(flux_count >> 24); // big endian
    params[1] = static_cast<uint8_t>(flux_count >> 16);
    params[2] = static_cast<uint8_t>(flux_count >> 8);
    params[3] = static_cast<uint8_t>(flux_count);
    params[4] = ff_Wipe | ff_Index;

    if (!SendCmd(CMD_WRITEFLUX, &params, sizeof(params)))
        return false;

    return true;
}